

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::Scrollbar(ImGuiLayoutType direction)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiWindow *this;
  ImDrawList *this_00;
  undefined1 auVar3 [12];
  ulong uVar4;
  ImGuiContext *pIVar5;
  undefined4 id;
  ImU32 IVar6;
  ImRect *pIVar7;
  char *str;
  ImGuiCol idx;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar12;
  int iVar13;
  undefined1 auVar11 [12];
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  bool held;
  bool hovered;
  bool local_da;
  bool local_d9;
  undefined1 local_d8 [8];
  ImVec2 IStack_d0;
  undefined1 local_c8 [16];
  float local_b0;
  float local_ac;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (direction == 0) {
    str = "#SCROLLX";
  }
  local_c8._0_4_ = ImGuiWindow::GetID(this,str,(char *)0x0);
  bVar1 = (&this->ScrollbarX)[direction == 0];
  local_98 = 0.0;
  if (bVar1 == true) {
    local_98 = (pIVar5->Style).ScrollbarSize;
  }
  local_d8._0_4_ = (this->Pos).x;
  fVar23 = (this->Pos).y;
  local_b0 = (this->Size).x + (float)local_d8._0_4_;
  local_ac = (this->Size).y + fVar23;
  fVar22 = this->WindowBorderSize;
  if (direction == 0) {
    local_d8._0_4_ = (float)local_d8._0_4_ + fVar22;
    local_d8._4_4_ = local_ac - (pIVar5->Style).ScrollbarSize;
    IStack_d0.x = local_b0 - local_98;
    IStack_d0.y = local_ac;
  }
  else {
    local_d8._0_4_ = local_b0 - (pIVar5->Style).ScrollbarSize;
    fVar21 = 0.0;
    fVar20 = 0.0;
    if ((this->Flags & 1U) == 0) {
      fVar20 = (GImGui->Style).FramePadding.y;
      fVar20 = fVar20 + fVar20 + GImGui->FontBaseSize * this->FontWindowScale;
    }
    if (((uint)this->Flags >> 10 & 1) != 0) {
      fVar21 = (GImGui->Style).FramePadding.y;
      fVar21 = fVar21 + fVar21 +
               GImGui->FontBaseSize * this->FontWindowScale + (this->DC).MenuBarOffset.y;
    }
    local_d8._4_4_ = fVar23 + fVar22 + fVar20 + fVar21;
    IStack_d0.y = local_ac - local_98;
    IStack_d0.x = local_b0;
  }
  IStack_d0.x = IStack_d0.x - fVar22;
  IStack_d0.y = IStack_d0.y - fVar22;
  if ((0.0 < IStack_d0.x - (float)local_d8._0_4_) && (0.0 < IStack_d0.y - (float)local_d8._4_4_)) {
    if (direction == 0) {
      iVar10 = (uint)(bVar1 ^ 1) * 8 + 4;
      lVar8 = 0x20;
      local_a8 = 0x30;
    }
    else {
      iVar10 = ((uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2) + (uint)(bVar1 ^ 1) * 8;
      lVar8 = 0x24;
      local_a8 = 0x34;
    }
    this_00 = this->DrawList;
    IVar6 = GetColorU32(0xe,1.0);
    ImDrawList::AddRectFilled
              (this_00,(ImVec2 *)local_d8,&IStack_d0,IVar6,this->WindowRounding,iVar10);
    iVar10 = (int)(((IStack_d0.x - (float)local_d8._0_4_) + -2.0) * 0.5);
    iVar12 = (int)(((IStack_d0.y - (float)local_d8._4_4_) + -2.0) * 0.5);
    iVar13 = (int)(((IStack_d0.x - IStack_d0.x) + 0.0) * 0.0);
    iVar14 = (int)(((IStack_d0.y - IStack_d0.y) + 0.0) * 0.0);
    auVar18._0_4_ = -(uint)(iVar10 < 0);
    auVar18._4_4_ = -(uint)(iVar12 < 0);
    auVar18._8_4_ = -(uint)(iVar13 < 0);
    auVar18._12_4_ = -(uint)(iVar14 < 0);
    auVar19._0_4_ = -(uint)(3 < iVar10);
    auVar19._4_4_ = -(uint)(3 < iVar12);
    auVar19._8_4_ = -(uint)(0 < iVar13);
    auVar19._12_4_ = -(uint)(0 < iVar14);
    auVar15._0_8_ = CONCAT44((float)iVar12,(float)iVar10) ^ 0x8000000080000000;
    auVar15._8_4_ = -(float)iVar13;
    auVar15._12_4_ = -(float)iVar14;
    auVar19 = auVar18 & _DAT_00193ee0 | ~auVar18 & (auVar19 & _DAT_00193ed0 | ~auVar19 & auVar15);
    fStack_a0 = auVar19._0_4_;
    fVar23 = auVar19._4_4_;
    auVar16._0_8_ = auVar19._0_8_;
    auVar16._8_4_ = fStack_a0;
    auVar16._12_4_ = fVar23;
    local_d8._0_4_ = (float)local_d8._0_4_ - fStack_a0;
    fStack_a0 = IStack_d0.x + fStack_a0;
    fStack_9c = IStack_d0.y + fVar23;
    auVar3._4_8_ = auVar16._8_8_;
    auVar3._0_4_ = (float)local_d8._4_4_ + fVar23;
    auVar17._0_8_ = auVar3._0_8_ << 0x20;
    auVar17._8_4_ = fStack_a0;
    auVar17._12_4_ = fStack_9c;
    IStack_d0 = auVar17._8_8_;
    local_68 = (float)local_d8._0_4_;
    if (direction != 0) {
      fStack_a0 = fStack_9c;
      local_68 = (float)local_d8._4_4_ - fVar23;
    }
    local_68 = fStack_a0 - local_68;
    id = local_c8._0_4_;
    local_c8 = ZEXT416((uint)(&(this->Scroll).x)[direction != 0]);
    local_98 = *(float *)((long)&this->Name + lVar8) - local_98;
    local_88 = ZEXT416((uint)local_98);
    fVar22 = *(float *)((long)&this->Name + local_a8);
    local_78 = ZEXT416((uint)fVar22);
    fVar22 = (float)(~-(uint)(local_98 <= fVar22) & (uint)local_98 |
                    -(uint)(local_98 <= fVar22) & (uint)fVar22);
    if (fVar22 <= 1.0) {
      fVar22 = 1.0;
    }
    fVar21 = (local_98 / fVar22) * local_68;
    fVar22 = (pIVar5->Style).GrabMinSize;
    fVar20 = local_68;
    if (fVar21 <= local_68) {
      fVar20 = fVar21;
    }
    uVar9 = -(uint)(fVar21 < fVar22);
    local_98 = (float)(uVar9 & (uint)fVar22 | ~uVar9 & (uint)fVar20);
    local_a8 = CONCAT44(fStack_9c,local_98 / local_68);
    local_da = false;
    local_d9 = false;
    IVar2 = pIVar5->ActiveId;
    local_d8._4_4_ = (float)local_d8._4_4_ - fVar23;
    fStack_94 = fStack_9c;
    fStack_90 = fStack_a0;
    fStack_8c = fStack_9c;
    fStack_64 = fStack_9c;
    fStack_60 = fStack_a0;
    fStack_5c = fStack_9c;
    ButtonBehavior((ImRect *)local_d8,id,&local_d9,&local_da,0x2000);
    fVar23 = 1.0;
    if (1.0 <= (float)local_78._0_4_ - (float)local_88._0_4_) {
      fVar23 = (float)local_78._0_4_ - (float)local_88._0_4_;
    }
    fVar22 = (float)local_c8._0_4_ / fVar23;
    auVar11 = ZEXT812(0x3f800000);
    if (fVar22 <= 1.0) {
      auVar11._4_8_ = 0;
      auVar11._0_4_ = fVar22;
    }
    local_c8._4_4_ = 0;
    local_c8._0_4_ =
         ((float)(~-(uint)(fVar22 < 0.0) & auVar11._0_4_) * (local_68 - local_98)) / local_68;
    local_c8._8_4_ = ~local_c8._8_4_ & auVar11._8_4_;
    local_c8._12_4_ = 0;
    if (((float)local_a8 < 1.0) && (local_da != false)) {
      local_88._0_4_ = local_68 - local_98;
      local_78._0_4_ = fVar23;
      pIVar7 = (ImRect *)(local_d8 + 4);
      if (direction == 0) {
        pIVar7 = (ImRect *)local_d8;
      }
      uVar4 = (ulong)(direction != 0);
      local_58 = ZEXT416((uint)(*(float *)((pIVar5->IO).MouseDown + uVar4 * 4 + -8) -
                               (pIVar7->Min).x));
      SetHoveredID(id);
      fVar22 = (float)local_58._0_4_ / local_68;
      fVar23 = 1.0;
      if (fVar22 <= 1.0) {
        fVar23 = fVar22;
      }
      fVar23 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar23);
      if (IVar2 == id) {
        fVar22 = (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4];
        bVar1 = false;
      }
      else if ((fVar23 < (float)local_c8._0_4_) ||
              ((float)local_a8 + (float)local_c8._0_4_ < fVar23)) {
        (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4] = 0.0;
        bVar1 = true;
        fVar22 = 0.0;
      }
      else {
        fVar22 = (float)local_a8 * -0.5 + (fVar23 - (float)local_c8._0_4_);
        (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4] = fVar22;
        bVar1 = false;
      }
      fVar20 = ((fVar23 - fVar22) - (float)local_a8 * 0.5) / (1.0 - (float)local_a8);
      fVar22 = 1.0;
      if (fVar20 <= 1.0) {
        fVar22 = fVar20;
      }
      fVar20 = (float)(int)((float)(~-(uint)(fVar20 < 0.0) & (uint)fVar22) * (float)local_78._0_4_ +
                           0.5);
      (&(this->Scroll).x)[direction != 0] = fVar20;
      fVar20 = fVar20 / (float)local_78._0_4_;
      fVar22 = 1.0;
      if (fVar20 <= 1.0) {
        fVar22 = fVar20;
      }
      fVar22 = ((float)local_88._0_4_ * (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar22)) / local_68;
      local_c8 = ZEXT416((uint)fVar22);
      if (bVar1) {
        (&(pIVar5->ScrollbarClickDeltaToGrabCenter).x)[uVar4] =
             -(float)local_a8 * 0.5 + (fVar23 - fVar22);
      }
    }
    idx = 0x11;
    if (local_da == false) {
      idx = (local_d9 & 1) + 0xf;
    }
    IVar6 = GetColorU32(idx,1.0);
    if (direction == 0) {
      local_40.x = (float)local_d8._0_4_ +
                   (IStack_d0.x - (float)local_d8._0_4_) * (float)local_c8._0_4_;
      local_38.x = local_98 + local_40.x;
      local_38.y = IStack_d0.y;
      local_40.y = (float)local_d8._4_4_;
      if (local_b0 <= local_98 + local_40.x) {
        local_38.x = local_b0;
      }
    }
    else {
      local_40.y = (IStack_d0.y - (float)local_d8._4_4_) * (float)local_c8._0_4_ +
                   (float)local_d8._4_4_;
      local_38.y = local_98 + local_40.y;
      local_38.x = IStack_d0.x;
      local_40.x = (float)local_d8._0_4_;
      if (local_ac <= local_38.y) {
        local_38.y = local_ac;
      }
    }
    ImDrawList::AddRectFilled
              (this->DrawList,&local_40,&local_38,IVar6,(pIVar5->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiLayoutType direction)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (direction == ImGuiLayoutType_Horizontal);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);
    if (bb.GetWidth() <= 0.0f || bb.GetHeight() <= 0.0f)
        return;

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, window_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, window_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}